

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm.h
# Opt level: O0

ymfm_output<6> * __thiscall ymfm::ymfm_output<6>::clamp16(ymfm_output<6> *this)

{
  int32_t iVar1;
  uint local_14;
  uint32_t index;
  ymfm_output<6> *this_local;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    iVar1 = clamp(this->data[local_14],-0x8000,0x7fff);
    this->data[local_14] = iVar1;
  }
  return this;
}

Assistant:

ymfm_output &clamp16()
	{
		for (uint32_t index = 0; index < NumOutputs; index++)
			data[index] = clamp(data[index], -32768, 32767);
		return *this;
	}